

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  char *pcVar1;
  ImFontConfig *pIVar2;
  void *ptr;
  ImFont **ppIVar3;
  ImFont *pIVar4;
  ImFontConfig *pIVar5;
  ImFontAtlasCustomRect *ptr_00;
  int iVar6;
  long lVar7;
  long lVar8;
  
  if (this->Locked != false) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_draw.cpp"
                  ,0x611,"void ImFontAtlas::ClearInputData()");
  }
  iVar6 = (this->ConfigData).Size;
  if (0 < iVar6) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pIVar2 = (this->ConfigData).Data;
      ptr = *(void **)(pIVar2->Name + lVar7 + -0x56);
      if ((ptr != (void *)0x0) && (pIVar2->Name[lVar7 + -0x4a] == '\x01')) {
        ImGui::MemFree(ptr);
        if ((this->ConfigData).Size <= lVar8) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                        ,0x503,"T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]");
        }
        pcVar1 = ((this->ConfigData).Data)->Name + lVar7 + -0x56;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
      }
      lVar8 = lVar8 + 1;
      iVar6 = (this->ConfigData).Size;
      lVar7 = lVar7 + 0x88;
    } while (lVar8 < iVar6);
  }
  lVar7 = (long)(this->Fonts).Size;
  if (0 < lVar7) {
    ppIVar3 = (this->Fonts).Data;
    pIVar2 = (this->ConfigData).Data;
    lVar8 = 0;
    do {
      pIVar4 = ppIVar3[lVar8];
      pIVar5 = pIVar4->ConfigData;
      if ((pIVar2 <= pIVar5) && (pIVar5 < pIVar2 + iVar6)) {
        pIVar4->ConfigData = (ImFontConfig *)0x0;
        ppIVar3[lVar8]->ConfigDataCount = 0;
      }
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  pIVar2 = (this->ConfigData).Data;
  if (pIVar2 != (ImFontConfig *)0x0) {
    (this->ConfigData).Size = 0;
    (this->ConfigData).Capacity = 0;
    ImGui::MemFree(pIVar2);
    (this->ConfigData).Data = (ImFontConfig *)0x0;
  }
  ptr_00 = (this->CustomRects).Data;
  if (ptr_00 != (ImFontAtlasCustomRect *)0x0) {
    (this->CustomRects).Size = 0;
    (this->CustomRects).Capacity = 0;
    ImGui::MemFree(ptr_00);
    (this->CustomRects).Data = (ImFontAtlasCustomRect *)0x0;
  }
  this->CustomRectIds[0] = -1;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            IM_FREE(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    for (int n = 0; n < IM_ARRAYSIZE(CustomRectIds); n++)
        CustomRectIds[n] = -1;
}